

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsprg.cpp
# Opt level: O3

CTPNStmObject * __thiscall
CTcParser::parse_object_body
          (CTcParser *this,int *err,CTcSymObj *obj_sym,int is_class,int is_anon,int is_grammar,
          int is_nested,int modify,CTcSymObj *mod_orig_sym,int plus_cnt,CTcSymMetaclass *meta_sym,
          tcprs_term_info *term_info,int trans)

{
  undefined1 *puVar1;
  ulong uVar2;
  int iVar3;
  tc_metaclass_t tVar4;
  uint uVar5;
  CTcSymObj *pCVar6;
  _func_int **pp_Var7;
  long lVar8;
  CTcTokenizer *this_00;
  int iVar9;
  CTPNStmObjectBase *this_01;
  CTcDictPropEntry *pCVar10;
  CTcPrsNode *pCVar11;
  CTPNObjProp *pCVar12;
  CTPNStmObject **ppCVar13;
  ulong uVar14;
  tcprs_term_info *term_info_00;
  byte bVar15;
  CTcTokFileDesc *pCVar16;
  CTcSymProp *prop_sym;
  ulong uVar17;
  CTPNObjDef *this_02;
  tcprs_term_info my_term_info;
  
  term_info_00 = term_info;
  if (term_info == (tcprs_term_info *)0x0) {
    term_info_00 = &my_term_info;
  }
  this_01 = (CTPNStmObjectBase *)CTcPrsAllocObj::operator_new((CTcPrsAllocObj *)0x80,(size_t)err);
  CTPNStmObjectBase::CTPNStmObjectBase(this_01,obj_sym,is_class);
  (this_01->super_CTPNStmTop).super_CTPNStm.super_CTPNStmBase.super_CTcPrsNode.super_CTcPrsNodeBase.
  _vptr_CTcPrsNodeBase = (_func_int **)&PTR_gen_code_00319630;
  (this_01->super_CTPNObjDef)._vptr_CTPNObjDef = (_func_int **)&PTR_is_inline_object_00319760;
  if (obj_sym != (CTcSymObj *)0x0) {
    (obj_sym->super_CTcSymObjBase).obj_stm_ = (CTPNStmObject *)this_01;
  }
  if (trans != 0) {
    puVar1 = &(this_01->super_CTPNObjDef).field_0x49;
    *puVar1 = *puVar1 | 8;
  }
  iVar3 = this->self_valid_;
  this->self_valid_ = 1;
  if (is_anon != 0 && obj_sym != (CTcSymObj *)0x0) {
    add_anon_obj(this,obj_sym);
  }
  this_00 = G_tok;
  lVar8 = G_tok->last_linenum_;
  (this_01->super_CTPNStmTop).super_CTPNStm.super_CTPNStmBase.file_ = G_tok->last_desc_;
  (this_01->super_CTPNStmTop).super_CTPNStm.super_CTPNStmBase.linenum_ = lVar8;
  if (modify == 0) {
    if (is_grammar == 0 && is_anon == 0) {
      if ((this_00->curtok_).typ_ == TOKT_COLON) {
        CTcTokenizer::next(this_00);
      }
      else {
        CTcTokenizer::log_error_curtok(this_00,0x2b5d);
      }
    }
    if (obj_sym != (CTcSymObj *)0x0) {
      (obj_sym->super_CTcSymObjBase).sc_name_head_ = (CTPNSuperclass *)0x0;
      (obj_sym->super_CTcSymObjBase).sc_name_tail_ = (CTPNSuperclass *)0x0;
    }
    parse_superclass_list(this,obj_sym,&(this_01->super_CTPNObjDef).sclist_);
    mod_orig_sym = obj_sym;
  }
  else if (mod_orig_sym != (CTcSymObj *)0x0) {
    CTPNStmObjectBase::add_superclass(this_01,(CTcSymbol *)mod_orig_sym);
  }
  for (pCVar10 = this->dict_prop_head_; pCVar10 != (CTcDictPropEntry *)0x0; pCVar10 = pCVar10->nxt_)
  {
    pCVar10->field_0x10 = pCVar10->field_0x10 & 0xfe;
  }
  this_02 = &this_01->super_CTPNObjDef;
  if (plus_cnt != 0) {
    if (((this->plus_prop_ == (CTcSymProp *)0x0) ||
        (this->plus_stack_alloc_ < (ulong)(long)plus_cnt)) ||
       (this->plus_stack_[(long)plus_cnt - 1] == (CTPNStmObject *)0x0)) {
      CTcTokenizer::log_error(0x2b94);
    }
    else {
      pCVar6 = (this->plus_stack_[(long)plus_cnt - 1]->super_CTPNStmObjectBase).super_CTPNObjDef.
               obj_sym_;
      if (pCVar6 != (CTcSymObj *)0x0) {
        pp_Var7 = (_func_int **)(pCVar6->super_CTcSymObjBase).obj_id_;
        tVar4 = (pCVar6->super_CTcSymObjBase).metaclass_;
        pCVar11 = (CTcPrsNode *)
                  CTcPrsAllocObj::operator_new((CTcPrsAllocObj *)0x30,(size_t)mod_orig_sym);
        *(undefined4 *)&pCVar11[1].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase = 7;
        pCVar11[2].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase = pp_Var7;
        *(tc_metaclass_t *)&pCVar11[3].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase = tVar4;
        *(undefined1 *)&pCVar11[5].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase = 0;
        (pCVar11->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase = (_func_int **)&PTR_gen_code_00314838;
        pCVar12 = CTPNObjDef::add_prop(this_02,this->plus_prop_,pCVar11,0,0);
        puVar1 = &(pCVar12->super_CTPNObjPropBase).field_0x58;
        *puVar1 = *puVar1 | 2;
      }
    }
  }
  if ((is_nested == 0) && (is_class == 0 || plus_cnt != 0)) {
    uVar17 = (ulong)plus_cnt;
    if (this->plus_stack_alloc_ <= uVar17) {
      uVar2 = uVar17 + 0x10;
      ppCVar13 = (CTPNStmObject **)realloc(this->plus_stack_,uVar17 * 8 + 0x80);
      this->plus_stack_ = ppCVar13;
      uVar14 = this->plus_stack_alloc_;
      if (uVar14 < uVar2) {
        do {
          this->plus_stack_[uVar14] = (CTPNStmObject *)0x0;
          uVar14 = uVar14 + 1;
        } while (uVar2 != uVar14);
      }
      this->plus_stack_alloc_ = uVar2;
    }
    this->plus_stack_[uVar17] = (CTPNStmObject *)this_01;
  }
  pCVar16 = (CTcTokFileDesc *)err;
  if ((G_tok->curtok_).typ_ == TOKT_LBRACE) {
    CTcTokenizer::next(G_tok);
    parse_obj_template(this,err,this_02,0);
    if (*err == 0) {
      iVar9 = 1;
LAB_001dbb76:
      if (is_class == 0 && modify == 0) {
        pp_Var7 = (_func_int **)this->src_order_idx_;
        this->src_order_idx_ = (long)pp_Var7 + 1;
        pCVar11 = (CTcPrsNode *)CTcPrsAllocObj::operator_new((CTcPrsAllocObj *)0x30,(size_t)pCVar16)
        ;
        *(undefined4 *)&pCVar11[1].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase = 3;
        pCVar11[2].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase = pp_Var7;
        *(undefined4 *)&pCVar11[3].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase = 0;
        *(undefined1 *)&pCVar11[5].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase = 0;
        (pCVar11->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase = (_func_int **)&PTR_gen_code_00314838;
        prop_sym = this->src_order_sym_;
        pCVar12 = CTPNObjDef::add_prop(this_02,prop_sym,pCVar11,0,0);
        puVar1 = &(pCVar12->super_CTPNObjPropBase).field_0x58;
        *puVar1 = *puVar1 | 2;
        if ((this->field_0xec & 2) != 0) {
          uVar5 = this->src_group_id_;
          pCVar11 = (CTcPrsNode *)
                    CTcPrsAllocObj::operator_new((CTcPrsAllocObj *)0x30,(size_t)prop_sym);
          *(undefined4 *)&pCVar11[1].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase = 7;
          pCVar11[2].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase = (_func_int **)(ulong)uVar5;
          *(undefined4 *)&pCVar11[3].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase = 0;
          *(undefined1 *)&pCVar11[5].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase = 0;
          (pCVar11->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase =
               (_func_int **)&PTR_gen_code_00314838;
          pCVar12 = CTPNObjDef::add_prop(this_02,this->src_group_sym_,pCVar11,0,0);
          puVar1 = &(pCVar12->super_CTPNObjPropBase).field_0x58;
          *puVar1 = *puVar1 | 2;
        }
      }
      iVar9 = parse_obj_prop_list(this,err,this_02,meta_sym,modify,is_nested,iVar9,0,&my_term_info,
                                  term_info_00);
      if (iVar9 != 0) {
        pCVar10 = this->dict_prop_head_;
        if (pCVar10 != (CTcDictPropEntry *)0x0 && meta_sym == (CTcSymMetaclass *)0x0) {
          do {
            if ((pCVar10->field_0x10 & 1) == 0) {
              bVar15 = (byte)meta_sym & 0xfe;
              meta_sym = (CTcSymMetaclass *)(ulong)bVar15;
              pCVar11 = (CTcPrsNode *)
                        CTcPrsAllocObj::operator_new((CTcPrsAllocObj *)0x30,(size_t)err);
              *(undefined4 *)&pCVar11[1].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase = 10;
              *(byte *)&pCVar11[5].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase = bVar15;
              (pCVar11->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase =
                   (_func_int **)&PTR_gen_code_00314838;
              err = (int *)pCVar10->prop_;
              CTPNObjDef::add_prop(this_02,(CTcSymProp *)err,pCVar11,0,0);
            }
            pCVar10 = pCVar10->nxt_;
          } while (pCVar10 != (CTcDictPropEntry *)0x0);
        }
        goto LAB_001dbce3;
      }
    }
  }
  else {
    parse_obj_template(this,err,this_02,0);
    if (*err == 0) {
      if ((G_tok->curtok_).typ_ == TOKT_LBRACE) {
        CTcTokenizer::next(G_tok);
        iVar9 = 1;
      }
      else if (is_nested == 0) {
        iVar9 = 0;
      }
      else {
        pCVar16 = term_info_00->desc_;
        if (term_info == (tcprs_term_info *)0x0) {
          term_info = &my_term_info;
        }
        iVar9 = 0;
        CTcMain::log_error(G_tcmain,pCVar16,term_info->linenum_,TC_SEV_ERROR,0x2baf);
        term_info->unterm_ = 1;
      }
      goto LAB_001dbb76;
    }
  }
  this_01 = (CTPNStmObjectBase *)0x0;
LAB_001dbce3:
  this->self_valid_ = iVar3;
  return (CTPNStmObject *)this_01;
}

Assistant:

CTPNStmObject *CTcParser::parse_object_body(
    int *err, CTcSymObj *obj_sym,
    int is_class, int is_anon, int is_grammar, int is_nested,
    int modify, CTcSymObj *mod_orig_sym, int plus_cnt,
    CTcSymMetaclass *meta_sym, tcprs_term_info *term_info, int trans)
{
    /* 
     *   If we don't have an enclosing term_info, use my own; if a valid
     *   term_info was passed in, continue using the enclosing one.  We
     *   always want to use the outermost term_info, because our heuristic
     *   is to assume that any lack of termination applies to the first
     *   object it possibly could apply to. 
     */
    tcprs_term_info my_term_info;
    if (term_info == 0)
        term_info = &my_term_info;

    /* presume the object won't use braces around its property list */
    int braces = FALSE;

    /* create the object statement */
    CTPNStmObject *obj_stm = new CTPNStmObject(obj_sym, is_class);
    if (obj_sym != 0)
        obj_sym->set_obj_stm(obj_stm);

    /* set the 'transient' status if appropriate */
    if (trans)
        obj_stm->set_transient();

    /* remember whether 'self' was valid in the enclosing context */
    int old_self_valid = self_valid_;

    /* 'self' is valid within object definitions */
    self_valid_ = TRUE;

    /* if it's anonymous, add it to the anonymous object list */
    if (is_anon && obj_sym != 0)
        add_anon_obj(obj_sym);

    /* 
     *   set the object's line location (we must do this explicitly
     *   because we're in a top-level statement and hence do not have a
     *   current source position saved at the moment) 
     */
    obj_stm->set_source_pos(G_tok->get_last_desc(),
                            G_tok->get_last_linenum());

    /* 
     *   If we're not modifying, parse the class list.  If this is a
     *   'modify' statement, there's no class list.  
     */
    if (!modify)
    {
        /* 
         *   Parse and skip the colon, if required.  All objects except
         *   anonymous objects and grammar rule definitions have the colon;
         *   for anonymous objects and grammar definitions, the caller is
         *   required to advance us to the class list before parsing the
         *   object body.  
         */
        if (is_anon || is_grammar)
        {
            /* 
             *   it's anonymous, or it's a grammar definition - the caller
             *   will have already advanced us to the class list, so there's
             *   no need to look for a colon 
             */
        }
        else if (G_tok->cur() == TOKT_COLON)
        {
            /* skip the colon */
            G_tok->next();
        }
        else
        {
            /* it's an error, but assume they simply left off the colon */
            G_tok->log_error_curtok(TCERR_OBJDEF_REQ_COLON);
        }

        /* 
         *   Drop any existing list of superclass names from the symbol.  We
         *   might have a list of names from loading the symbol file; if so,
         *   forget that, and use the list defined here instead.  
         */
        if (obj_sym != 0)
            obj_sym->clear_sc_names();
        
        /* parse the superclass list */
        parse_superclass_list(obj_sym, obj_stm->get_superclass_list());
    }
    else
    {
        /*
         *   This is a 'modify' statement.  The original pre-modified
         *   object is our single superclass. 
         *   
         *   Note that we do not do anything with the superclass name list,
         *   because we're reassigning the symbol representing the global
         *   name of the object (obj_sym) to refer to the new modifier
         *   object.  As far as the name structure of the program is
         *   concerned, this object's superclass list is the same as the
         *   original object's superclass list.  
         */
        if (mod_orig_sym != 0)
            obj_stm->add_superclass(mod_orig_sym);
    }

    /* 
     *   clear the list of dictionary properties, so we can keep track of
     *   which dictionary properties this object explicitly defines 
     */
    for (CTcDictPropEntry *dict_prop = dict_prop_head_ ; dict_prop != 0 ;
         dict_prop = dict_prop->nxt_)
    {
        /* mark this dictionary property as not defined for this object */
        dict_prop->defined_ = FALSE;
    }

    /*
     *   If we have a '+' list, figure the object's location by finding
     *   the item in the location stack at the desired depth. 
     */
    if (plus_cnt != 0)
    {
        /* 
         *   if no '+' property has been defined, or they're asking for a
         *   nesting level that doesn't exist, note the error and ignore the
         *   '+' setting 
         */
        if (plus_prop_ == 0
            || (size_t)plus_cnt > plus_stack_alloc_
            || plus_stack_[plus_cnt - 1] == 0)
        {
            /* log the error */
            G_tok->log_error(TCERR_PLUSOBJ_TOO_MANY);
        }
        else
        {
            /* 
             *   find the object - the location of an object with N '+'
             *   signs is the object most recently defined with N-1 '+'
             *   signs 
             */
            CTPNStmObject *loc = plus_stack_[plus_cnt - 1];

            /* add the '+' property value, if it's a valid object symbol */
            if (loc->get_obj_sym() != 0)
            {
                /* set up a constant expression for the object reference */
                CTcConstVal cval;
                cval.set_obj(loc->get_obj_sym()->get_obj_id(),
                             loc->get_obj_sym()->get_metaclass());
                CTcPrsNode *expr = new CTPNConst(&cval);
                
                /* add the location property */
                CTPNObjProp *prop = obj_stm->add_prop(
                    plus_prop_, expr, FALSE, FALSE);

                /* 
                 *   mark it as overwritable, since it was added via the '+'
                 *   notation 
                 */
                prop->set_overwritable();
            }
        }
    }

    /*
     *   Remember this object as the most recent object defined with its
     *   number of '+' signs.  Only pay attention to '+' signs for top-level
     *   objects - if this is a nested object, it doesn't participate in the
     *   '+' mechanism at all.  Also, ignore classes defined with no '+'
     *   signs - the '+' mechanism is generally only useful for instances,
     *   so ignore it for classes that don't use the notation explicitly.  
     */
    if (!is_nested && (!is_class || plus_cnt != 0))
    {
        /* first, allocate more space in the '+' stack if necessary */
        if ((size_t)plus_cnt >= plus_stack_alloc_)
        {
            size_t new_alloc;
            size_t i;
            
            /* 
             *   allocate more space - go a bit above what we need to avoid
             *   having to reallocate again immediately if they a few levels
             *   deeper 
             */
            new_alloc = plus_cnt + 16;
            plus_stack_ = (CTPNStmObject **)
                          t3realloc(plus_stack_,
                                    new_alloc * sizeof(*plus_stack_));
            
            /* clear out the newly-allocated entries */
            for (i = plus_stack_alloc_ ; i < new_alloc ; ++i)
                plus_stack_[i] = 0;
            
            /* remember the new allocation size */
            plus_stack_alloc_ = new_alloc;
        }
        
        /* remember this object as the last object at its depth */
        plus_stack_[plus_cnt] = obj_stm;
    }

    /*
     *   Check for an open brace.  If the object uses braces around its
     *   property list, template properties can be either before the open
     *   brace or just inside it. 
     */
    if (G_tok->cur() == TOKT_LBRACE)
    {
        /* skip the open brace */
        G_tok->next();

        /* note that we're using braces */
        braces = TRUE;
    }

    /* check for template syntax */
    parse_obj_template(err, obj_stm, FALSE);
    if (*err)
    {
        self_valid_ = old_self_valid;
        return 0;
    }

    /*
     *   If we didn't already find an open brace, try again now that we've
     *   scanned the template properties, since template properties can
     *   either immediately precede or immediately follow the open brace, if
     *   present. 
     */
    if (!braces && G_tok->cur() == TOKT_LBRACE)
    {
        /* note that we're using braces */
        braces = TRUE;

        /* skip the open brace */
        G_tok->next();
    }

    /*
     *   If this is a nested object, the property list must be enclosed in
     *   braces.  If we haven't found a brace by this point, it's an error.  
     */
    if (is_nested && !braces)
    {
        /* 
         *   No braces - this is illegal, because a nested object requires
         *   braces.  The most likely error is that the previous object was
         *   not properly terminated, and this is simply a new object
         *   definition.  Flag the error as a missing terminator on the
         *   enclosing object.  
         */
        G_tcmain->log_error(term_info->desc_, term_info->linenum_,
                            TC_SEV_ERROR, TCERR_UNTERM_OBJ_DEF);

        /* set the termination error flag for the caller */
        term_info->unterm_ = TRUE;
    }

    /*
     *   If we're not a class, and we're not a 'modify', add the automatic
     *   'sourceTextOrder' property, add the 'sourceTextGroup' if desired.
     *   sourceTextOrder provides a source file sequence number that can be
     *   used to order a set of objects into the same sequence in which they
     *   appeared in the original source file, which is often useful for
     *   assembling pre-initialized structures.  sourceTextGroup identifies
     *   the file itself.  
     */
    if (!is_class && !modify)
    {
        /* set up the constant expression for the source sequence number */
        CTcConstVal cval;
        cval.set_int(src_order_idx_++);
        CTcPrsNode *expr = new CTPNConst(&cval);

        /* create the new sourceTextOrder property */
        CTPNObjProp *prop = obj_stm->add_prop(
            src_order_sym_, expr, FALSE, FALSE);

        /* mark it as overwritable with an explicit property definition */
        prop->set_overwritable();

        /* if we're generating sourceTextGroup properties, add it */
        if (src_group_mode_)
        {
            /* set up the expression for the source group object */
            cval.set_obj(src_group_id_, TC_META_TADSOBJ);
            expr = new CTPNConst(&cval);

            /* create the new sourceTextGroup property */
            prop = obj_stm->add_prop(src_group_sym_, expr, FALSE, FALSE);

            /* mark it as overwritable */
            prop->set_overwritable();
        }
    }

    /* parse the property list */
    if (!parse_obj_prop_list(
        err, obj_stm, meta_sym, modify, is_nested, braces, FALSE,
        &my_term_info, term_info))
    {
        self_valid_ = old_self_valid;
        return 0;
    }

    /* 
     *   Finish the object by adding dictionary property placeholders.  Don't
     *   bother if this is an intrinsic class modifier, since intrinsic class
     *   objects can't have dictionary associations.  
     */
    if (obj_stm != 0 && meta_sym == 0)
    {
        /* 
         *   Add a placeholder for each dictionary property we didn't
         *   explicitly define for the object.  This will ensure that we have
         *   enough property slots pre-allocated at link time if the object
         *   inherits vocabulary from its superclasses.  The linker will
         *   remove any slots that end up being unused, so this won't affect
         *   run-time efficiency or the ultimate size of the image file.
         */
        for (CTcDictPropEntry *dict_prop = dict_prop_head_ ; dict_prop != 0 ;
             dict_prop = dict_prop->nxt_)
        {
            /* if this one isn't defined, add a placeholder */
            if (!dict_prop->defined_)
            {
                /* set up a VOCAB_LIST value */
                CTcConstVal cval;
                cval.set_vocab_list();
                CTcPrsNode *expr = new CTPNConst(&cval);

                /* add it */
                obj_stm->add_prop(dict_prop->prop_, expr, FALSE, FALSE);
            }
        }
    }

    /* restore the enclosing 'self' validity */
    self_valid_ = old_self_valid;

    /* return the object statement node */
    return obj_stm;
}